

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall ApprovalTests::Options::Options(Options *this,Scrubber *scrubber)

{
  undefined8 uVar1;
  undefined1 local_40 [16];
  code *local_30;
  code *local_28;
  
  (this->fileOptions_).options_ = (Options *)0x0;
  (this->fileOptions_).fileExtensionWithDot_._M_dataplus._M_p =
       (pointer)&(this->fileOptions_).fileExtensionWithDot_.field_2;
  *(undefined4 *)&(this->fileOptions_).fileExtensionWithDot_.field_2 = 0x7478742e;
  (this->fileOptions_).fileExtensionWithDot_._M_string_length = 4;
  (this->fileOptions_).fileExtensionWithDot_.field_2._M_local_buf[4] = '\0';
  *(undefined8 *)&(this->scrubber_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scrubber_).super__Function_base._M_functor + 8) = 0;
  (this->scrubber_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scrubber_)._M_invoker = scrubber->_M_invoker;
  if ((scrubber->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(scrubber->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->scrubber_).super__Function_base._M_functor =
         *(undefined8 *)&(scrubber->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->scrubber_).super__Function_base._M_functor + 8) = uVar1;
    (this->scrubber_).super__Function_base._M_manager = (scrubber->super__Function_base)._M_manager;
    (scrubber->super__Function_base)._M_manager = (_Manager_type)0x0;
    scrubber->_M_invoker = (_Invoker_type)0x0;
  }
  defaultReporter();
  this->reporter_ = &defaultReporter::defaultReporter.super_Reporter;
  DefaultNamerFactory::getDefaultNamer();
  if (local_30 != (code *)0x0) {
    (*local_28)(&this->namer_);
    if (local_30 != (code *)0x0) {
      (*local_30)(local_40,local_40,3);
    }
    this->usingDefaultScrubber_ = false;
    return;
  }
  ::std::__throw_bad_function_call();
}

Assistant:

Options::Options(Scrubber scrubber) : scrubber_(std::move(scrubber))
    {
        usingDefaultScrubber_ = false;
    }